

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

CordBuffer __thiscall
absl::lts_20250127::Cord::GetAppendBufferSlowPath
          (Cord *this,size_t block_size,size_t capacity,size_t min_capacity)

{
  Nullable<absl::cord_internal::CordRep_*> rep;
  Nullable<absl::cord_internal::CordzInfo_*> info;
  CordRepFlat *rep_00;
  undefined8 extraout_RDX;
  size_t in_R8;
  ExtractResult EVar2;
  CordBuffer CVar3;
  ExtractResult result;
  CordzUpdateScope scope;
  CordRep *tree;
  MethodIdentifier method;
  size_t min_capacity_local;
  size_t capacity_local;
  size_t block_size_local;
  Cord *this_local;
  undefined8 uVar1;
  
  rep = InlineRep::tree((InlineRep *)block_size);
  if (rep == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    CVar3 = CreateAppendBuffer((lts_20250127 *)this,(InlineData *)block_size,capacity,min_capacity);
    uVar1 = CVar3.rep_.field_0._8_8_;
  }
  else {
    info = InlineRep::cordz_info((InlineRep *)block_size);
    cord_internal::CordzUpdateScope::CordzUpdateScope
              ((CordzUpdateScope *)&result.extracted,info,kGetAppendBuffer);
    EVar2 = ExtractAppendBuffer(rep,in_R8);
    result.tree = EVar2.extracted;
    if (result.tree == (CordRep *)0x0) {
      if (capacity == 0) {
        CordBuffer::CreateWithDefaultLimit((CordBuffer *)this,min_capacity);
      }
      else {
        CordBuffer::CreateWithCustomLimit((CordBuffer *)this,capacity,min_capacity);
      }
    }
    else {
      InlineRep::SetTreeOrEmpty
                ((InlineRep *)block_size,EVar2.tree,(CordzUpdateScope *)&result.extracted);
      rep_00 = cord_internal::CordRep::flat(result.tree);
      CordBuffer::CordBuffer((CordBuffer *)this,rep_00);
    }
    cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&result.extracted);
    uVar1 = extraout_RDX;
  }
  CVar3.rep_.field_0.long_rep.padding = (void *)uVar1;
  CVar3.rep_.field_0.long_rep.rep = (CordRepFlat *)this;
  return (CordBuffer)CVar3.rep_.field_0;
}

Assistant:

CordBuffer Cord::GetAppendBufferSlowPath(size_t block_size, size_t capacity,
                                         size_t min_capacity) {
  auto constexpr method = CordzUpdateTracker::kGetAppendBuffer;
  CordRep* tree = contents_.tree();
  if (tree != nullptr) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    CordRep::ExtractResult result = ExtractAppendBuffer(tree, min_capacity);
    if (result.extracted != nullptr) {
      contents_.SetTreeOrEmpty(result.tree, scope);
      return CordBuffer(result.extracted->flat());
    }
    return block_size ? CordBuffer::CreateWithCustomLimit(block_size, capacity)
                      : CordBuffer::CreateWithDefaultLimit(capacity);
  }
  return CreateAppendBuffer(contents_.data_, block_size, capacity);
}